

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

void enet_peer_throttle_configure
               (ENetPeer *peer,enet_uint32 interval,enet_uint32 acceleration,
               enet_uint32 deceleration)

{
  ENetOutgoingCommand *outgoingCommand;
  
  peer->packetThrottleInterval = interval;
  peer->packetThrottleAcceleration = acceleration;
  peer->packetThrottleDeceleration = deceleration;
  outgoingCommand = (ENetOutgoingCommand *)(*callbacks.malloc)(0x60);
  if (outgoingCommand != (ENetOutgoingCommand *)0x0) {
    *(undefined2 *)&outgoingCommand->command = 0xff8b;
    (outgoingCommand->command).disconnect.data =
         interval >> 0x18 | (interval & 0xff0000) >> 8 | (interval & 0xff00) << 8 | interval << 0x18
    ;
    (outgoingCommand->command).connect.mtu =
         acceleration >> 0x18 | (acceleration & 0xff0000) >> 8 | (acceleration & 0xff00) << 8 |
         acceleration << 0x18;
    (outgoingCommand->command).connect.windowSize =
         deceleration >> 0x18 | (deceleration & 0xff0000) >> 8 | (deceleration & 0xff00) << 8 |
         deceleration << 0x18;
    outgoingCommand->fragmentOffset = 0;
    outgoingCommand->fragmentLength = 0;
    outgoingCommand->packet = (ENetPacket *)0x0;
    enet_peer_setup_outgoing_command(peer,outgoingCommand);
    return;
  }
  (*callbacks.no_memory)();
  return;
}

Assistant:

void enet_peer_throttle_configure(ENetPeer *peer, enet_uint32 interval, enet_uint32 acceleration, enet_uint32 deceleration) {
        ENetProtocol command;

        peer->packetThrottleInterval     = interval;
        peer->packetThrottleAcceleration = acceleration;
        peer->packetThrottleDeceleration = deceleration;

        command.header.command   = (int)ENET_PROTOCOL_COMMAND_THROTTLE_CONFIGURE | (int)ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
        command.header.channelID = 0xFF;

        command.throttleConfigure.packetThrottleInterval     = ENET_HOST_TO_NET_32(interval);
        command.throttleConfigure.packetThrottleAcceleration = ENET_HOST_TO_NET_32(acceleration);
        command.throttleConfigure.packetThrottleDeceleration = ENET_HOST_TO_NET_32(deceleration);

        enet_peer_queue_outgoing_command(peer, &command, NULL, 0, 0);
    }